

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find.hpp
# Opt level: O0

const_iterator * __thiscall
trial::dynamic::value::find<std::allocator<char>,bool>
          (const_iterator *__return_storage_ptr__,value *this,
          basic_variable<std::allocator<char>_> *self,bool *other)

{
  bool bVar1;
  type tVar2;
  value vVar3;
  const_reference lhs;
  int local_50;
  const_iterator local_40;
  byte local_21;
  basic_variable<std::allocator<char>_> *local_20;
  bool *other_local;
  basic_variable<std::allocator<char>_> *self_local;
  const_iterator *it;
  
  local_20 = self;
  other_local = (bool *)this;
  self_local = (basic_variable<std::allocator<char>_> *)__return_storage_ptr__;
  vVar3 = basic_variable<std::allocator<char>_>::symbol
                    ((basic_variable<std::allocator<char>_> *)this);
  if (vVar3 == null) {
    basic_variable<std::allocator<char>_>::end
              (__return_storage_ptr__,(basic_variable<std::allocator<char>_> *)other_local);
  }
  else if (vVar3 - boolean < 7) {
    tVar2 = dynamic::operator==((basic_variable<std::allocator<char>_> *)other_local,
                                (bool *)local_20);
    if (tVar2) {
      basic_variable<std::allocator<char>_>::begin
                (__return_storage_ptr__,(basic_variable<std::allocator<char>_> *)other_local);
    }
    else {
      basic_variable<std::allocator<char>_>::end
                (__return_storage_ptr__,(basic_variable<std::allocator<char>_> *)other_local);
    }
  }
  else {
    local_21 = 0;
    basic_variable<std::allocator<char>_>::begin
              (__return_storage_ptr__,(basic_variable<std::allocator<char>_> *)other_local);
    while( true ) {
      basic_variable<std::allocator<char>_>::end
                (&local_40,(basic_variable<std::allocator<char>_> *)other_local);
      bVar1 = basic_variable<std::allocator<char>_>::const_iterator::operator!=
                        (__return_storage_ptr__,&local_40);
      basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_40);
      if (!bVar1) break;
      lhs = basic_variable<std::allocator<char>_>::const_iterator::operator*(__return_storage_ptr__)
      ;
      tVar2 = dynamic::operator==(lhs,(bool *)local_20);
      if (tVar2) {
        local_21 = 1;
        local_50 = 1;
        goto LAB_00130228;
      }
      basic_variable<std::allocator<char>_>::
      iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::operator++(&__return_storage_ptr__->
                    super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  );
    }
    local_50 = 3;
LAB_00130228:
    if ((local_21 & 1) == 0) {
      basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(__return_storage_ptr__)
      ;
    }
    if (local_50 != 1) {
      basic_variable<std::allocator<char>_>::end
                (__return_storage_ptr__,(basic_variable<std::allocator<char>_> *)other_local);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

auto find(const basic_variable<Allocator>& self,
          const T& other) -> typename basic_variable<Allocator>::const_iterator
{
    switch (self.symbol())
    {
    case symbol::null:
        return self.end();

    case symbol::boolean:
    case symbol::integer:
    case symbol::real:
    case symbol::string:
    case symbol::wstring:
    case symbol::u16string:
    case symbol::u32string:
        return (self == other) ? self.begin() : self.end();

    case symbol::array:
    case symbol::map:
        for (auto it = self.begin(); it != self.end(); ++it)
        {
            if (*it == other)
                return it;
        }
        return self.end();
    }
    TRIAL_DYNAMIC_UNREACHABLE();
}